

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PartitioningAroundMedoids.h
# Opt level: O0

void __thiscall
CPartitioningAroundMedois<CDissimilarityMatrix<float>_>::AddMedoid
          (CPartitioningAroundMedois<CDissimilarityMatrix<float>_> *this,size_t medoid)

{
  StateType SVar1;
  size_t sVar2;
  size_type sVar3;
  size_t sVar4;
  reference pvVar5;
  bool bVar6;
  DistanceType DVar7;
  DistanceType DVar8;
  ulong local_38;
  size_t object;
  unsigned_long *local_28;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_20;
  size_t local_18;
  size_t medoid_local;
  CPartitioningAroundMedois<CDissimilarityMatrix<float>_> *this_local;
  
  local_18 = medoid;
  medoid_local = (size_t)this;
  SVar1 = State(this);
  bVar6 = true;
  if (SVar1 != Initializing) {
    SVar1 = State(this);
    bVar6 = SVar1 == Building;
  }
  sVar4 = local_18;
  if (!bVar6) {
    __assert_fail("State() == Initializing || State() == Building",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/al-pacino[P]Clustering/src_nothreads/PartitioningAroundMedoids.h"
                  ,0x59,
                  "void CPartitioningAroundMedois<CDissimilarityMatrix<float>>::AddMedoid(size_t) [DISSIMILARITY_MATRIX_TYPE = CDissimilarityMatrix<float>]"
                 );
  }
  sVar2 = NumberOfObjects(this);
  if (sVar2 <= sVar4) {
    __assert_fail("medoid < NumberOfObjects()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/al-pacino[P]Clustering/src_nothreads/PartitioningAroundMedoids.h"
                  ,0x5a,
                  "void CPartitioningAroundMedois<CDissimilarityMatrix<float>>::AddMedoid(size_t) [DISSIMILARITY_MATRIX_TYPE = CDissimilarityMatrix<float>]"
                 );
  }
  bVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::empty(&this->medoids);
  SVar1 = State(this);
  if (bVar6 != (SVar1 == Initializing)) {
    __assert_fail("medoids.empty() == ( State() == Initializing )",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/al-pacino[P]Clustering/src_nothreads/PartitioningAroundMedoids.h"
                  ,0x5b,
                  "void CPartitioningAroundMedois<CDissimilarityMatrix<float>>::AddMedoid(size_t) [DISSIMILARITY_MATRIX_TYPE = CDissimilarityMatrix<float>]"
                 );
  }
  sVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(&this->medoids);
  sVar4 = NumberOfClusters(this);
  if (sVar4 <= sVar3) {
    __assert_fail("medoids.size() < NumberOfClusters()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/al-pacino[P]Clustering/src_nothreads/PartitioningAroundMedoids.h"
                  ,0x5c,
                  "void CPartitioningAroundMedois<CDissimilarityMatrix<float>>::AddMedoid(size_t) [DISSIMILARITY_MATRIX_TYPE = CDissimilarityMatrix<float>]"
                 );
  }
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back(&this->medoids,&local_18);
  SVar1 = State(this);
  if (SVar1 == Initializing) {
    local_20._M_current =
         (unsigned_long *)
         std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin(&this->objectMedoids);
    local_28 = (unsigned_long *)
               std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end(&this->objectMedoids)
    ;
    object._4_4_ = 0;
    std::
    fill<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,int>
              (local_20,(__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                         )local_28,(int *)((long)&object + 4));
    this->state = Building;
  }
  else {
    for (local_38 = 0; sVar4 = NumberOfObjects(this), local_38 < sVar4; local_38 = local_38 + 1) {
      bVar6 = IsMedoid(this,local_38);
      if (!bVar6) {
        DVar7 = CDissimilarityMatrix<float>::Distance(this->matrix,local_38,local_18);
        DVar8 = distanceToMedoid(this,local_38);
        sVar4 = local_18;
        if (DVar7 < DVar8) {
          pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                             (&this->objectMedoids,local_38);
          *pvVar5 = sVar4;
        }
      }
    }
    sVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(&this->medoids);
    sVar4 = NumberOfClusters(this);
    if (sVar3 == sVar4) {
      this->state = Swapping;
      findObjectMedoids(this);
    }
  }
  return;
}

Assistant:

void CPartitioningAroundMedois<DMT>::AddMedoid( size_t medoid )
{
	assert( State() == Initializing || State() == Building );
	assert( medoid < NumberOfObjects() );
	assert( medoids.empty() == ( State() == Initializing ) );
	assert( medoids.size() < NumberOfClusters() );

	medoids.push_back( medoid );

	if( State() == Initializing ) {
		fill( objectMedoids.begin(), objectMedoids.end(), 0 );
		state = Building;
	} else {
		// calculate new objectMedoids
		for( size_t object = 0; object < NumberOfObjects(); object++ ) {
			if( IsMedoid( object ) ) {
				continue; // if object is medoid
			}

			if( matrix.Distance( object, medoid ) < distanceToMedoid( object ) ) {
				objectMedoids[object] = medoid;
			}
		}

		if( medoids.size() == NumberOfClusters() ) {
			state = Swapping;

			findObjectMedoids();
		}
	}
}